

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QMYSQLResultPrivate::QMyField>::reallocateAndGrow
          (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMYSQLResultPrivate::QMyField> *old)

{
  QArrayData *pQVar1;
  QMyField *pQVar2;
  qsizetype qVar3;
  char *pcVar4;
  MYSQL_FIELD *pMVar5;
  my_bool mVar6;
  undefined7 uVar7;
  QMyField *data;
  long lVar8;
  QMyField *pQVar9;
  QMyField *pQVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  QArrayDataPointer<QMYSQLResultPrivate::QMyField> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar11 = QArrayData::reallocateUnaligned
                        (pQVar1,this->ptr,0x28,
                         n + this->size +
                         ((long)((long)this->ptr -
                                ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                         -0x3333333333333333,Grow);
    this->d = (Data *)auVar11._0_8_;
    this->ptr = (QMyField *)auVar11._8_8_;
  }
  else {
    local_38.size = -0x5555555555555556;
    local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_38.ptr = (QMyField *)0xaaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar8 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if (0 < lVar8) {
          pQVar9 = this->ptr;
          pQVar2 = pQVar9 + lVar8;
          pQVar10 = local_38.ptr + local_38.size;
          do {
            pQVar10->bufLength = pQVar9->bufLength;
            pcVar4 = pQVar9->outField;
            pMVar5 = pQVar9->myField;
            mVar6 = pQVar9->nullIndicator;
            uVar7 = *(undefined7 *)&pQVar9->field_0x19;
            (pQVar10->type).d_ptr = (pQVar9->type).d_ptr;
            pQVar10->nullIndicator = mVar6;
            *(undefined7 *)&pQVar10->field_0x19 = uVar7;
            pQVar10->outField = pcVar4;
            pQVar10->myField = pMVar5;
            pQVar9 = pQVar9 + 1;
            local_38.size = local_38.size + 1;
            pQVar10 = pQVar10 + 1;
          } while (pQVar9 < pQVar2);
        }
      }
      else if (0 < lVar8) {
        pQVar9 = this->ptr;
        pQVar2 = pQVar9 + lVar8;
        pQVar10 = local_38.ptr + local_38.size;
        do {
          pQVar10->bufLength = pQVar9->bufLength;
          pcVar4 = pQVar9->outField;
          pMVar5 = pQVar9->myField;
          mVar6 = pQVar9->nullIndicator;
          uVar7 = *(undefined7 *)&pQVar9->field_0x19;
          (pQVar10->type).d_ptr = (pQVar9->type).d_ptr;
          pQVar10->nullIndicator = mVar6;
          *(undefined7 *)&pQVar10->field_0x19 = uVar7;
          pQVar10->outField = pcVar4;
          pQVar10->myField = pMVar5;
          pQVar9 = pQVar9 + 1;
          local_38.size = local_38.size + 1;
          pQVar10 = pQVar10 + 1;
        } while (pQVar9 < pQVar2);
      }
    }
    pQVar1 = &this->d->super_QArrayData;
    this->d = local_38.d;
    pQVar2 = this->ptr;
    this->ptr = local_38.ptr;
    qVar3 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar1;
    local_38.ptr = pQVar2;
    local_38.size = qVar3;
    if (old != (QArrayDataPointer<QMYSQLResultPrivate::QMyField> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar1;
      local_38.ptr = old->ptr;
      old->ptr = pQVar2;
      local_38.size = old->size;
      old->size = qVar3;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x28,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }